

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction * __thiscall
pbrt::Cylinder::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Cylinder *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  Transform *this_00;
  Transform *pTVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  Vector3f wo_00;
  Vector3f dpdu;
  Point3f pHit;
  undefined8 local_1a8;
  Point2f local_168;
  Tuple3<pbrt::Vector3,_float> local_150;
  Point3f local_140;
  Point3fi local_130;
  SurfaceInteraction local_118;
  
  local_140.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  local_140.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_140.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  fVar1 = this->phiMax;
  fVar14 = this->zMax - this->zMin;
  auVar6 = vinsertps_avx(ZEXT416((uint)isect->phi),
                         ZEXT416((uint)(local_140.super_Tuple3<pbrt::Point3,_float>.z - this->zMin))
                         ,0x10);
  auVar24 = ZEXT416((uint)fVar14);
  auVar23 = vinsertps_avx(ZEXT416((uint)fVar1),auVar24,0x10);
  auVar6 = vdivps_avx(auVar6,auVar23);
  auVar26 = ZEXT816(0) << 0x20;
  fVar7 = fVar1 * -fVar1;
  auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar14),auVar24,auVar26);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_140.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar8 = fVar1 * (float)local_140.super_Tuple3<pbrt::Point3,_float>.x;
  auVar23 = vmovshdup_avx(auVar25);
  fVar9 = auVar23._0_4_ * -fVar1;
  fVar10 = fVar8 * 0.0;
  auVar28 = ZEXT416((uint)fVar8);
  auVar21 = vfmadd213ss_fma(ZEXT816(0),ZEXT416((uint)fVar9),ZEXT416((uint)fVar10));
  auVar20 = ZEXT416((uint)fVar9);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),auVar20,auVar20);
  auVar24 = vfmadd231ss_fma(auVar21,auVar24,auVar26);
  auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar9)),auVar20,ZEXT416((uint)fVar14));
  fVar1 = fVar14 * fVar8 + 0.0;
  fVar5 = (0.0 - fVar14 * fVar9) + auVar21._0_4_;
  auVar27._0_12_ = ZEXT812(0);
  auVar27._12_4_ = 0;
  auVar21 = vfmsub213ss_fma(auVar27,auVar20,ZEXT416((uint)fVar10));
  auVar20 = vfnmadd231ss_avx512f(ZEXT416((uint)fVar10),auVar28,auVar26);
  fVar10 = auVar21._0_4_ + auVar20._0_4_;
  auVar21 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
  auVar21 = vaddss_avx512f(ZEXT416((uint)(fVar1 * fVar1 + fVar5 * fVar5)),auVar21);
  auVar21 = vsqrtss_avx(auVar21,auVar21);
  fVar29 = auVar21._0_4_;
  auVar21._0_4_ = fVar1 / fVar29;
  auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar20._0_4_ = fVar10 / fVar29;
  auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)((fVar5 / fVar29) * auVar23._0_4_ * fVar7)),auVar21,
                            ZEXT416((uint)(fVar7 * (float)local_140.
                                                          super_Tuple3<pbrt::Point3,_float>.x)));
  auVar23 = vfmadd231ss_fma(auVar23,auVar20,ZEXT416((uint)(fVar7 * 0.0)));
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)((fVar5 / fVar29) * 0.0)),auVar26,auVar21);
  auVar21 = vfmadd231ss_fma(auVar21,auVar26,auVar20);
  auVar27 = ZEXT416((uint)(auVar24._0_4_ * auVar24._0_4_));
  auVar20 = vfmsub213ss_fma(auVar17,auVar22,auVar27);
  auVar18 = vfnmadd231ss_fma(auVar27,auVar24,auVar24);
  auVar27 = vfmsub231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar23._0_4_)),auVar21,auVar24);
  auVar17 = vfmsub231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar21._0_4_)),auVar21,auVar24);
  fVar1 = auVar18._0_4_ + auVar20._0_4_;
  auVar22 = ZEXT416((uint)(auVar22._0_4_ * -auVar21._0_4_));
  auVar23 = vfmadd213ss_fma(auVar23,auVar24,auVar22);
  auVar21 = vfmadd213ss_fma(auVar21,auVar24,auVar22);
  uVar15 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar26,0);
  fVar16 = (float)((uint)!(bool)((byte)uVar15 & 1) * (int)(1.0 / fVar1));
  auVar22._8_4_ = 0x7fffffff;
  auVar22._0_8_ = 0x7fffffff7fffffff;
  auVar22._12_4_ = 0x7fffffff;
  auVar22 = vandps_avx512vl(auVar25,auVar22);
  fVar7 = fVar16 * auVar27._0_4_;
  fVar29 = fVar16 * auVar23._0_4_;
  auVar23._8_4_ = 0x34400002;
  auVar23._0_8_ = 0x3440000234400002;
  auVar23._12_4_ = 0x34400002;
  auVar23 = vmulps_avx512vl(auVar22,auVar23);
  fVar11 = fVar16 * auVar21._0_4_;
  fVar12 = fVar29 * 0.0;
  auVar22 = vmulss_avx512f(auVar28,ZEXT416((uint)fVar7));
  local_150._0_8_ = vmovlps_avx(auVar23);
  local_150.z = 0.0;
  bVar2 = this->reverseOrientation;
  this_00 = this->renderFromObject;
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  bVar3 = this->transformSwapsHandedness;
  pTVar4 = this->objectFromRender;
  fVar16 = fVar16 * auVar17._0_4_;
  auVar24 = vmulss_avx512f(auVar28,ZEXT416((uint)fVar16));
  fVar13 = fVar11 * 0.0;
  fVar5 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar10 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[0][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[0][0]));
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[1][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[1][0]));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[2][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[2][0]));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar10),ZEXT416((uint)(pTVar4->m).m[0][2]));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar10),ZEXT416((uint)(pTVar4->m).m[1][2]));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar10),ZEXT416((uint)(pTVar4->m).m[2][2]));
  auVar23 = vinsertps_avx(auVar23,auVar21,0x10);
  Point3fi::Point3fi(&local_130,&local_140,(Vector3f *)&local_150);
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = auVar24._0_4_ + fVar13;
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = fVar9 * fVar16 + fVar13;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = auVar22._0_4_ + fVar12;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = fVar9 * fVar7 + fVar12;
  local_1a8 = auVar23._0_8_;
  auVar23 = vinsertps_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar8),0x10);
  local_168.super_Tuple2<pbrt::Point2,_float> = auVar6._0_8_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_130.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_130.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_130.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = fVar7 * 0.0 + fVar14 * fVar29;
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = fVar16 * 0.0 + fVar14 * fVar11;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar17._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1a8;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1a8._4_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar23._0_8_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar19._4_8_ = 0;
  auVar19._0_4_ = fVar14;
  SurfaceInteraction::SurfaceInteraction
            (&local_118,pi,local_168,wo_00,dpdu,(Vector3f)(auVar19 << 0x40),dndu,dndv,time,
             bVar2 != bVar3);
  Transform::operator()(__return_storage_ptr__,this_00,&local_118);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of cylinder hit
        Float u = phi / phiMax;
        Float v = (pHit.z - zMin) / (zMax - zMin);
        // Compute cylinder $\dpdu$ and $\dpdv$
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv(0, 0, zMax - zMin);

        // Compute cylinder $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv(0, 0, 0), d2Pdvv(0, 0, 0);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for cylinder intersection
        Vector3f pError = gamma(3) * Abs(Vector3f(pHit.x, pHit.y, 0));

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }